

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPDefaultClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPDefaultClause *this)

{
  OpenMPDirective *this_00;
  long lVar1;
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  string local_78;
  OpenMPDefaultClauseKind local_54;
  undefined1 local_50 [4];
  OpenMPDefaultClauseKind default_kind;
  string parameter_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPDefaultClause *local_18;
  OpenMPDefaultClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPDefaultClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"default (",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::__cxx11::string::string((string *)local_50);
  local_54 = getDefaultClauseKind(this);
  switch(local_54) {
  case OMPC_DEFAULT_private:
    std::__cxx11::string::operator=((string *)local_50,"private");
    break;
  case OMPC_DEFAULT_firstprivate:
    std::__cxx11::string::operator=((string *)local_50,"firstprivate");
    break;
  case OMPC_DEFAULT_shared:
    std::__cxx11::string::operator=((string *)local_50,"shared");
    break;
  case OMPC_DEFAULT_none:
    std::__cxx11::string::operator=((string *)local_50,"none");
    break;
  case OMPC_DEFAULT_variant:
    this_00 = getVariantDirective(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"",&local_e9);
    OpenMPDirective::generatePragmaString(&local_78,this_00,&local_98,&local_c0,&local_e8);
    std::__cxx11::string::operator=((string *)local_50,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    break;
  default:
    std::operator<<((ostream *)&std::cout,"The parameter of default clause is not supported.\n");
  }
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_130,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_130);
    std::__cxx11::string::~string(local_130);
  }
  else {
    std::operator+(&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   ") ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
  }
  local_19 = 1;
  std::__cxx11::string::~string((string *)local_50);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPDefaultClause::toString() {

    std::string result = "default (";
    std::string parameter_string;
    OpenMPDefaultClauseKind default_kind = this->getDefaultClauseKind();
    switch (default_kind) {
        case OMPC_DEFAULT_shared:
            parameter_string = "shared";
            break;
        case OMPC_DEFAULT_private:
            parameter_string = "private";
            break;
        case OMPC_DEFAULT_firstprivate:
            parameter_string = "firstprivate";
            break;
        case OMPC_DEFAULT_none:
            parameter_string = "none";
            break;
        case OMPC_DEFAULT_variant:
            parameter_string = this->getVariantDirective()->generatePragmaString("", "", "");
            break;
        default:
            std::cout << "The parameter of default clause is not supported.\n";
    };

    if (parameter_string.size() > 0) {
        result += parameter_string + ") ";
    }
    else {
        result = result.substr(0, result.size()-2);
    }

    return result;
}